

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFNameTreeObjectHelper.cc
# Opt level: O2

int __thiscall QPDFNameTreeObjectHelper::remove(QPDFNameTreeObjectHelper *this,char *__filename)

{
  NNTreeImpl *this_00;
  int iVar1;
  QPDFObjectHandle QStack_28;
  
  this_00 = (((this->m).
              super___shared_ptr<QPDFNameTreeObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->impl).super___shared_ptr<NNTreeImpl,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  QPDFObjectHandle::newUnicodeString(&QStack_28,(string *)__filename);
  iVar1 = NNTreeImpl::remove(this_00,(char *)&QStack_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&QStack_28.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return iVar1;
}

Assistant:

bool
QPDFNameTreeObjectHelper::remove(std::string const& key, QPDFObjectHandle* value)
{
    return m->impl->remove(QPDFObjectHandle::newUnicodeString(key), value);
}